

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprAssignXNext(Fts5ExprNode *pNode)

{
  int iVar1;
  Fts5ExprNearset *pFVar2;
  Fts5ExprNearset *pNear;
  Fts5ExprNode *pNode_local;
  
  iVar1 = pNode->eType;
  if (iVar1 == 1) {
    pNode->xNext = fts5ExprNodeNext_OR;
  }
  else if (iVar1 == 2) {
    pNode->xNext = fts5ExprNodeNext_AND;
  }
  else if (iVar1 == 9) {
    pFVar2 = pNode->pNear;
    if ((((pFVar2->nPhrase == 1) && (pFVar2->apPhrase[0]->nTerm == 1)) &&
        (pFVar2->apPhrase[0]->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) &&
       (pFVar2->apPhrase[0]->aTerm[0].bFirst == '\0')) {
      pNode->eType = 4;
      pNode->xNext = fts5ExprNodeNext_TERM;
    }
    else {
      pNode->xNext = fts5ExprNodeNext_STRING;
    }
  }
  else {
    pNode->xNext = fts5ExprNodeNext_NOT;
  }
  return;
}

Assistant:

static void fts5ExprAssignXNext(Fts5ExprNode *pNode){
  switch( pNode->eType ){
    case FTS5_STRING: {
      Fts5ExprNearset *pNear = pNode->pNear;
      if( pNear->nPhrase==1 && pNear->apPhrase[0]->nTerm==1
       && pNear->apPhrase[0]->aTerm[0].pSynonym==0
       && pNear->apPhrase[0]->aTerm[0].bFirst==0
      ){
        pNode->eType = FTS5_TERM;
        pNode->xNext = fts5ExprNodeNext_TERM;
      }else{
        pNode->xNext = fts5ExprNodeNext_STRING;
      }
      break;
    };

    case FTS5_OR: {
      pNode->xNext = fts5ExprNodeNext_OR;
      break;
    };

    case FTS5_AND: {
      pNode->xNext = fts5ExprNodeNext_AND;
      break;
    };

    default: assert( pNode->eType==FTS5_NOT ); {
      pNode->xNext = fts5ExprNodeNext_NOT;
      break;
    };
  }
}